

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O2

vector<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_> *
vkt::wsi::anon_unknown_0::generateSwapchainParameterCases
          (vector<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
           *__return_storage_ptr__,Type wsiType,TestDimension dimension,InstanceInterface *vki,
          VkPhysicalDevice physicalDevice,VkSurfaceKHR surface)

{
  pointer pVVar1;
  VkColorSpaceKHR VVar2;
  VkSurfaceTransformFlagBitsKHR VVar3;
  PlatformProperties *pPVar4;
  deUint32 flags;
  uint uVar5;
  uint uVar6;
  VkCompositeAlphaFlagBitsKHR VVar7;
  VkSurfaceTransformFlagBitsKHR VVar8;
  deUint32 dVar9;
  const_iterator curFmt;
  long lVar10;
  pointer pVVar11;
  deUint32 imageCount;
  deUint32 dVar12;
  pointer pVVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ulong uVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  VkSurfaceCapabilitiesKHR capabilities;
  undefined1 local_c8 [44];
  VkExtent2D local_9c;
  undefined8 local_94;
  undefined8 uStack_8c;
  deUint32 *local_80;
  VkSurfaceTransformFlagBitsKHR local_78;
  undefined8 local_74;
  VkBool32 local_6c;
  VkSwapchainKHR local_68;
  vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_> presentModes;
  vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_> formats;
  
  ::vk::wsi::getPhysicalDeviceSurfaceCapabilities(&capabilities,vki,physicalDevice,surface);
  ::vk::wsi::getPhysicalDeviceSurfaceFormats(&formats,vki,physicalDevice,surface);
  ::vk::wsi::getPhysicalDeviceSurfacePresentModes(&presentModes,vki,physicalDevice,surface);
  pPVar4 = ::vk::wsi::getPlatformProperties(wsiType);
  (__return_storage_ptr__->
  super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((capabilities.supportedTransforms & 1) != 0) {
    capabilities.currentTransform = VK_SURFACE_TRANSFORM_IDENTITY_BIT_KHR;
  }
  local_c8._0_4_ = VK_STRUCTURE_TYPE_SWAPCHAIN_CREATE_INFO_KHR;
  local_c8._8_8_ = (void *)0x0;
  local_c8._16_4_ = 0;
  local_c8._24_8_ = 0;
  local_c8._32_4_ = capabilities.minImageCount;
  local_c8._36_8_ =
       *formats.super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>.
        _M_impl.super__Vector_impl_data._M_start;
  local_9c = *(VkExtent2D *)
              (local_c8 +
              (ulong)(pPVar4->swapchainExtent == SWAPCHAIN_EXTENT_SETS_WINDOW_SIZE) * 8 + -0x2c);
  local_94._0_4_ = 1;
  local_94._4_4_ = 0x10;
  uStack_8c._0_4_ = VK_SHARING_MODE_EXCLUSIVE;
  uStack_8c._4_4_ = 0;
  local_80 = (deUint32 *)0x0;
  local_74._0_4_ = VK_COMPOSITE_ALPHA_OPAQUE_BIT_KHR;
  local_74._4_4_ = VK_PRESENT_MODE_FIFO_KHR;
  local_6c = 0;
  local_68.m_internal = 0;
  local_78 = capabilities.currentTransform;
  switch(dimension) {
  case TEST_DIMENSION_MIN_IMAGE_COUNT:
    uVar6 = capabilities.minImageCount + 0x10;
    if (capabilities.maxImageCount != 0) {
      uVar6 = capabilities.maxImageCount;
    }
    uVar5 = 0x10;
    if (uVar6 < 0x10) {
      uVar5 = uVar6;
    }
    if (0x10 < capabilities.minImageCount) {
      uVar5 = capabilities.minImageCount;
    }
    for (dVar12 = capabilities.minImageCount; dVar12 <= uVar5; dVar12 = dVar12 + 1) {
      std::vector<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>::
      push_back(__return_storage_ptr__,(value_type *)local_c8);
      (__return_storage_ptr__->
      super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
      )._M_impl.super__Vector_impl_data._M_finish[-1].minImageCount = dVar12;
    }
    break;
  case TEST_DIMENSION_IMAGE_FORMAT:
    for (pVVar11 = formats.
                   super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pVVar11 !=
        formats.super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>.
        _M_impl.super__Vector_impl_data._M_finish; pVVar11 = pVVar11 + 1) {
      std::vector<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>::
      push_back(__return_storage_ptr__,(value_type *)local_c8);
      pVVar1 = (__return_storage_ptr__->
               super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      VVar2 = pVVar11->colorSpace;
      pVVar1[-1].imageFormat = pVVar11->format;
      pVVar1[-1].imageColorSpace = VVar2;
    }
    break;
  case TEST_DIMENSION_IMAGE_EXTENT:
    if (pPVar4->swapchainExtent - SWAPCHAIN_EXTENT_SETS_WINDOW_SIZE < 2) {
      for (lVar10 = 0; lVar10 != 0x28; lVar10 = lVar10 + 8) {
        std::vector<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>::
        push_back(__return_storage_ptr__,(value_type *)local_c8);
        auVar14._8_8_ = 0;
        auVar14._0_8_ =
             *(ulong *)((long)&wsi::(anonymous_namespace)::
                               generateSwapchainParameterCases(vk::wsi::Type,vkt::wsi::(anonymous_namespace)::TestDimension,vk::VkSurfaceCapabilitiesKHR_const&,std::vector<vk::VkSurfaceFormatKHR,std::allocator<vk::VkSurfaceFormatKHR>>const&,std::vector<vk::VkPresentModeKHR,std::allocator<vk::VkPresentModeKHR>>const&)
                               ::s_testSizes + lVar10);
        auVar15._8_8_ = 0;
        auVar15._0_4_ = capabilities.minImageExtent.width;
        auVar15._4_4_ = capabilities.minImageExtent.height;
        auVar16._8_8_ = 0;
        auVar16._0_4_ = capabilities.maxImageExtent.width;
        auVar16._4_4_ = capabilities.maxImageExtent.height;
        iVar18 = SUB164(auVar14 ^ _DAT_0094e180,0);
        iVar19 = SUB164(auVar14 ^ _DAT_0094e180,4);
        uVar17 = CONCAT44(-(uint)(iVar19 < SUB164(auVar15 ^ _DAT_0094e180,4)),
                          -(uint)(iVar18 < SUB164(auVar15 ^ _DAT_0094e180,0)));
        uVar20 = CONCAT44(-(uint)(iVar19 < SUB164(auVar16 ^ _DAT_0094e180,4)),
                          -(uint)(iVar18 < SUB164(auVar16 ^ _DAT_0094e180,0)));
        (__return_storage_ptr__->
        super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
        )._M_impl.super__Vector_impl_data._M_finish[-1].imageExtent =
             (VkExtent2D)
             (~uVar17 & (~uVar20 & (ulong)capabilities.maxImageExtent |
                        *(ulong *)((long)&wsi::(anonymous_namespace)::
                                          generateSwapchainParameterCases(vk::wsi::Type,vkt::wsi::(anonymous_namespace)::TestDimension,vk::VkSurfaceCapabilitiesKHR_const&,std::vector<vk::VkSurfaceFormatKHR,std::allocator<vk::VkSurfaceFormatKHR>>const&,std::vector<vk::VkPresentModeKHR,std::allocator<vk::VkPresentModeKHR>>const&)
                                          ::s_testSizes + lVar10) & uVar20) |
             (ulong)capabilities.minImageExtent & uVar17);
      }
      if (pPVar4->swapchainExtent != SWAPCHAIN_EXTENT_SETS_WINDOW_SIZE) goto LAB_006c8aa3;
    }
    else {
LAB_006c8aa3:
      std::vector<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>::
      push_back(__return_storage_ptr__,(value_type *)local_c8);
      (__return_storage_ptr__->
      super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
      )._M_impl.super__Vector_impl_data._M_finish[-1].imageExtent = capabilities.currentExtent;
      if (pPVar4->swapchainExtent == SWAPCHAIN_EXTENT_MUST_MATCH_WINDOW_SIZE) break;
    }
    std::vector<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>::
    push_back(__return_storage_ptr__,(value_type *)local_c8);
    (__return_storage_ptr__->
    super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>)
    ._M_impl.super__Vector_impl_data._M_finish[-1].imageExtent = capabilities.minImageExtent;
    std::vector<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>::
    push_back(__return_storage_ptr__,(value_type *)local_c8);
    (__return_storage_ptr__->
    super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>)
    ._M_impl.super__Vector_impl_data._M_finish[-1].imageExtent = capabilities.maxImageExtent;
    break;
  case TEST_DIMENSION_IMAGE_ARRAY_LAYERS:
    dVar12 = 0x10;
    if (capabilities.maxImageArrayLayers < 0x10) {
      dVar12 = capabilities.maxImageArrayLayers;
    }
    for (dVar9 = 1; dVar9 - dVar12 != 1; dVar9 = dVar9 + 1) {
      std::vector<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>::
      push_back(__return_storage_ptr__,(value_type *)local_c8);
      (__return_storage_ptr__->
      super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
      )._M_impl.super__Vector_impl_data._M_finish[-1].imageArrayLayers = dVar9;
    }
    break;
  case TEST_DIMENSION_IMAGE_USAGE:
    for (uVar6 = 1; uVar6 <= capabilities.supportedUsageFlags; uVar6 = uVar6 + 1) {
      if ((uVar6 & ~capabilities.supportedUsageFlags) == 0) {
        std::vector<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>::
        push_back(__return_storage_ptr__,(value_type *)local_c8);
        (__return_storage_ptr__->
        super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
        )._M_impl.super__Vector_impl_data._M_finish[-1].imageUsage = uVar6;
      }
    }
    break;
  case TEST_DIMENSION_IMAGE_SHARING_MODE:
    std::vector<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>::
    push_back(__return_storage_ptr__,(value_type *)local_c8);
    (__return_storage_ptr__->
    super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>)
    ._M_impl.super__Vector_impl_data._M_finish[-1].imageSharingMode = VK_SHARING_MODE_EXCLUSIVE;
    std::vector<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>::
    push_back(__return_storage_ptr__,(value_type *)local_c8);
    (__return_storage_ptr__->
    super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>)
    ._M_impl.super__Vector_impl_data._M_finish[-1].imageSharingMode = VK_SHARING_MODE_CONCURRENT;
    break;
  case TEST_DIMENSION_PRE_TRANSFORM:
    VVar3 = capabilities.supportedTransforms;
    for (VVar8 = VK_SURFACE_TRANSFORM_IDENTITY_BIT_KHR; VVar8 <= VVar3; VVar8 = VVar8 * 2) {
      if ((VVar8 & VVar3) != 0) {
        std::vector<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>::
        push_back(__return_storage_ptr__,(value_type *)local_c8);
        (__return_storage_ptr__->
        super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
        )._M_impl.super__Vector_impl_data._M_finish[-1].preTransform = VVar8;
        VVar3 = capabilities.supportedTransforms;
      }
    }
    break;
  case TEST_DIMENSION_COMPOSITE_ALPHA:
    for (VVar7 = VK_COMPOSITE_ALPHA_OPAQUE_BIT_KHR; VVar7 <= capabilities.supportedCompositeAlpha;
        VVar7 = VVar7 * 2) {
      if ((capabilities.supportedCompositeAlpha & VVar7) != 0) {
        std::vector<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>::
        push_back(__return_storage_ptr__,(value_type *)local_c8);
        (__return_storage_ptr__->
        super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
        )._M_impl.super__Vector_impl_data._M_finish[-1].compositeAlpha = VVar7;
      }
    }
    break;
  case TEST_DIMENSION_PRESENT_MODE:
    for (pVVar13 = presentModes.
                   super__Vector_base<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pVVar13 !=
        presentModes.super__Vector_base<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>
        ._M_impl.super__Vector_impl_data._M_finish; pVVar13 = pVVar13 + 1) {
      std::vector<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>::
      push_back(__return_storage_ptr__,(value_type *)local_c8);
      (__return_storage_ptr__->
      super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
      )._M_impl.super__Vector_impl_data._M_finish[-1].presentMode = *pVVar13;
    }
    break;
  case TEST_DIMENSION_CLIPPED:
    std::vector<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>::
    push_back(__return_storage_ptr__,(value_type *)local_c8);
    (__return_storage_ptr__->
    super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>)
    ._M_impl.super__Vector_impl_data._M_finish[-1].clipped = 0;
    std::vector<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>::
    push_back(__return_storage_ptr__,(value_type *)local_c8);
    (__return_storage_ptr__->
    super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>)
    ._M_impl.super__Vector_impl_data._M_finish[-1].clipped = 1;
  }
  std::_Vector_base<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>::~_Vector_base
            (&presentModes.
              super__Vector_base<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>);
  std::_Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>::~_Vector_base
            (&formats.
              super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>);
  return __return_storage_ptr__;
}

Assistant:

vector<VkSwapchainCreateInfoKHR> generateSwapchainParameterCases (Type								wsiType,
																  TestDimension						dimension,
																  const InstanceInterface&			vki,
																  VkPhysicalDevice					physicalDevice,
																  VkSurfaceKHR						surface)
{
	const VkSurfaceCapabilitiesKHR		capabilities	= getPhysicalDeviceSurfaceCapabilities(vki,
																							   physicalDevice,
																							   surface);
	const vector<VkSurfaceFormatKHR>	formats			= getPhysicalDeviceSurfaceFormats(vki,
																						  physicalDevice,
																						  surface);
	const vector<VkPresentModeKHR>		presentModes	= getPhysicalDeviceSurfacePresentModes(vki,
																							   physicalDevice,
																							   surface);

	return generateSwapchainParameterCases(wsiType, dimension, capabilities, formats, presentModes);
}